

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DBufferCase::createTexture(TexImage2DBufferCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deInt32 rowPitch_00;
  TransferFormat TVar4;
  reference pvVar5;
  size_type sVar6;
  int local_114;
  PixelBufferAccess local_108;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  undefined1 local_bc [8];
  Vec4 colorB;
  Vector<float,_4> local_9c;
  undefined1 local_8c [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  deUint32 buf;
  int height;
  int rowPitch;
  int rowLength;
  int pixelSize;
  deUint32 local_18;
  deUint32 dStack_14;
  TransferFormat transferFmt;
  TexImage2DBufferCase *this_local;
  
  TVar4 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar3 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
  if (this->m_rowLength < 1) {
    local_114 = (this->super_Texture2DSpecCase).m_width + this->m_skipPixels;
  }
  else {
    local_114 = this->m_rowLength;
  }
  rowPitch_00 = deAlign32(local_114 * iVar3,this->m_alignment);
  iVar1 = (this->super_Texture2DSpecCase).m_height;
  iVar2 = this->m_skipRows;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
             (long)(rowPitch_00 * (iVar1 + iVar2) + this->m_offset));
  tcu::operator-((tcu *)(cBias.m_data + 2),&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax
                 ,&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_9c,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_8c,&local_9c,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_dc,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_cc,&local_dc,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_bc,&local_cc,(Vector<float,_4> *)(colorA.m_data + 2));
  iVar1 = (this->super_Texture2DSpecCase).m_width;
  iVar2 = (this->super_Texture2DSpecCase).m_height;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_108,&(this->super_Texture2DSpecCase).m_texFormat,iVar1,iVar2,1,rowPitch_00,0,
             pvVar5 + (long)this->m_offset +
                      (long)(this->m_skipPixels * iVar3) + (long)(this->m_skipRows * rowPitch_00));
  tcu::fillWithGrid(&local_108,4,(Vec4 *)local_8c,(Vec4 *)local_bc);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             (long)(int)sVar6,pvVar5,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_18 = TVar4.format;
  dStack_14 = TVar4.dataType;
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             *(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             local_18,dStack_14,(void *)(long)this->m_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width + m_skipPixels;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						height			= m_height + m_skipRows;
		deUint32				buf				= 0;
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(rowPitch*height + m_offset);
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		// Create buffer and upload.
		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}